

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::resume_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  value_type vVar2;
  uint uVar3;
  size_type sVar4;
  uint *puVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  byte *pbVar9;
  const_reference pvVar10;
  ulong __n;
  uint *nxt;
  uint *puVar11;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pvVar7 == '?') {
    __assert_fail("dist.at(s) != INF8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicScalableKReach.cpp"
                  ,10,
                  "void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t, const std::vector<std::vector<vertex_t>> &, std::vector<distance_t> &)"
                 );
  }
  sVar4 = this->back_;
  this->back_ = sVar4 + 1;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar4);
  *pvVar8 = s;
  do {
    do {
      sVar4 = this->front_;
      if (this->back_ == sVar4) {
        return;
      }
      this->front_ = sVar4 + 1;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar4);
      __n = (ulong)*pvVar8;
      pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
    } while (this->k_ <= *pbVar9);
    pvVar10 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at(graph,__n);
    puVar5 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar11 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar5;
        puVar11 = puVar11 + 1) {
      pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar11);
      bVar1 = *pbVar9;
      pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
      if (*pbVar9 + 1 < (uint)bVar1) {
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (dist,(ulong)*puVar11);
        *pvVar7 = vVar2 + '\x01';
        if (this->isD2_ == true) {
          bVar6 = indexed(&this->parent_->D1_,*puVar11);
          if (bVar6) goto LAB_0010813a;
        }
        uVar3 = *puVar11;
        sVar4 = this->back_;
        this->back_ = sVar4 + 1;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar4);
        *pvVar8 = uVar3;
      }
LAB_0010813a:
    }
  } while( true );
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}